

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
               *this,GetterYs<unsigned_int> *getter1,GetterYRef *getter2,
              TransformerLogLin *transformer,ImU32 col)

{
  GetterYRef *pGVar1;
  int iVar2;
  ImVec2 IVar3;
  ImPlotPoint local_28;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar2 = getter2->Count;
  if (getter1->Count < getter2->Count) {
    iVar2 = getter1->Count;
  }
  this->Prims = iVar2 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  (this->P12).y = 0.0;
  local_28 = GetterYs<unsigned_int>::operator()(getter1,0);
  IVar3 = TransformerLogLin::operator()(transformer,&local_28);
  this->P11 = IVar3;
  pGVar1 = this->Getter2;
  local_28.y = pGVar1->YRef;
  local_28.x = pGVar1->XScale * 0.0 + pGVar1->X0;
  IVar3 = TransformerLogLin::operator()(this->Transformer,&local_28);
  this->P12 = IVar3;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }